

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeTryTable(TranslateToFuzzReader *this,Type type)

{
  Expression *pEVar1;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  bool bVar2;
  Index IVar3;
  value_type *this_00;
  pointer pTVar4;
  value_type *ppEVar5;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar6;
  Name NVar7;
  _Storage<wasm::Type,_true> local_210;
  undefined8 uStack_208;
  uintptr_t local_200;
  uintptr_t local_1f8;
  byte local_1e9;
  Type TStack_1e8;
  bool subOfTagTypeWithExn;
  value_type *local_1e0;
  byte local_1d1;
  Type TStack_1d0;
  bool subOfTagType;
  Type valueType;
  Name dest;
  Expression *target;
  Type TStack_1a8;
  int tries;
  Type tagTypeWithExn;
  Type local_198;
  allocator<wasm::Type> local_189;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> local_188;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> local_178;
  undefined1 local_168 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> vec;
  value_type *tag;
  Type tagType;
  Name tagName;
  Index i;
  Index numCatches;
  vector<bool,_std::allocator<bool>_> catchRefs;
  vector<wasm::Name,_std::allocator<wasm::Name>_> catchDests;
  vector<wasm::Name,_std::allocator<wasm::Name>_> catchTags;
  _Storage<wasm::Type,_true> local_a8;
  undefined8 uStack_a0;
  vector<bool,_std::allocator<bool>_> local_98;
  vector<wasm::Name,_std::allocator<wasm::Name>_> local_68;
  vector<wasm::Name,_std::allocator<wasm::Name>_> local_48;
  uintptr_t local_30;
  Expression *local_28;
  Expression *body;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  local_30 = type.id;
  body = (Expression *)this;
  this_local = (TranslateToFuzzReader *)type.id;
  local_28 = make(this,type);
  bVar2 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::empty
                    (&this->funcContext->breakableStack);
  pEVar1 = local_28;
  if (bVar2) {
    local_48.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector(&local_48);
    local_68.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector(&local_68);
    local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._12_4_ = 0;
    local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._12_4_ = 0;
    local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
    std::vector<bool,_std::allocator<bool>_>::vector(&local_98);
    std::optional<wasm::Type>::optional((optional<wasm::Type> *)&local_a8);
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = uStack_a0;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = local_a8;
    type_local.id =
         (uintptr_t)
         Builder::makeTryTable(&this->builder,pEVar1,&local_48,&local_68,&local_98,type_00);
    std::vector<bool,_std::allocator<bool>_>::~vector(&local_98);
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::~vector(&local_68);
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::~vector(&local_48);
  }
  else {
    bVar2 = std::
            vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
            ::empty((vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                     *)(this->wasm + 0x48));
    if (bVar2) {
      addTag(this);
    }
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
              ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)
               &catchDests.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
              ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)
               &catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage);
    std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)&i);
    IVar3 = upTo(this,(this->fuzzParams->super_FuzzParams).MAX_TRY_CATCHES);
    for (tagName.super_IString.str._M_str._0_4_ = 0; (uint)tagName.super_IString.str._M_str <= IVar3
        ; tagName.super_IString.str._M_str._0_4_ = (uint)tagName.super_IString.str._M_str + 1) {
      Name::Name((Name *)&tagType);
      Type::Type((Type *)&tag);
      if ((uint)tagName.super_IString.str._M_str < IVar3) {
        this_00 = pick<std::vector<std::unique_ptr<wasm::Tag,std::default_delete<wasm::Tag>>,std::allocator<std::unique_ptr<wasm::Tag,std::default_delete<wasm::Tag>>>>>
                            (this,(vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                                   *)(this->wasm + 0x48));
        pTVar4 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->(this_00);
        Name::operator=((Name *)&tagType,(Name *)pTVar4);
        pTVar4 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->(this_00);
        tag = (value_type *)Tag::params(pTVar4);
      }
      else {
        bVar2 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::empty
                          ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)
                           &catchDests.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        if (!bVar2) {
          bVar2 = oneIn(this,2);
          if (bVar2) break;
        }
        Type::Type((Type *)&vec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,none);
        tag = (value_type *)
              vec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
      }
      PVar6 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
              Type::begin((Type *)&tag);
      local_178 = PVar6;
      PVar6 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)Type::end((Type *)&tag)
      ;
      local_188 = PVar6;
      std::allocator<wasm::Type>::allocator(&local_189);
      std::vector<wasm::Type,std::allocator<wasm::Type>>::vector<wasm::Type::Iterator,void>
                ((vector<wasm::Type,std::allocator<wasm::Type>> *)local_168,(Iterator)local_178,
                 (Iterator)local_188,&local_189);
      std::allocator<wasm::Type>::~allocator(&local_189);
      HeapType::HeapType((HeapType *)&tagTypeWithExn,exn);
      Type::Type(&local_198,(HeapType)tagTypeWithExn.id,NonNullable,Inexact);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_168,&local_198);
      wasm::Type::Type(&stack0xfffffffffffffe58,(vector *)local_168);
      target._4_4_ = (this->fuzzParams->super_FuzzParams).TRIES;
      do {
        if (target._4_4_ < 1) goto LAB_001bbf24;
        ppEVar5 = pick<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                            (this,&this->funcContext->breakableStack);
        pEVar1 = *ppEVar5;
        NVar7 = getTargetName(this,pEVar1);
        valueType.id = NVar7.super_IString.str._M_len;
        TStack_1e8 = getTargetType(this,pEVar1);
        local_1e0 = tag;
        TStack_1d0 = TStack_1e8;
        local_1d1 = wasm::Type::isSubType((Type)tag,TStack_1e8);
        local_1d1 = local_1d1 & 1;
        local_1f8 = TStack_1a8.id;
        local_200 = TStack_1d0.id;
        local_1e9 = wasm::Type::isSubType(TStack_1a8,TStack_1d0);
        local_1e9 = local_1e9 & 1;
      } while (((local_1d1 & 1) == 0) && (target._4_4_ = target._4_4_ + -1, local_1e9 == 0));
      std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
                ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)
                 &catchDests.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(value_type *)&tagType);
      std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
                ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)
                 &catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage,(value_type *)&valueType);
      std::vector<bool,_std::allocator<bool>_>::push_back
                ((vector<bool,_std::allocator<bool>_> *)&i,(bool)(local_1e9 & 1));
LAB_001bbf24:
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_168);
    }
    pEVar1 = local_28;
    std::optional<wasm::Type>::optional((optional<wasm::Type> *)&local_210);
    type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = uStack_208;
    type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = local_210;
    type_local.id =
         (uintptr_t)
         Builder::makeTryTable
                   (&this->builder,pEVar1,
                    (vector<wasm::Name,_std::allocator<wasm::Name>_> *)
                    &catchDests.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                    (vector<wasm::Name,_std::allocator<wasm::Name>_> *)
                    &catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage,
                    (vector<bool,_std::allocator<bool>_> *)&i,type_01);
    std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)&i);
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::~vector
              ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)
               &catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage);
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::~vector
              ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)
               &catchDests.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  return (Expression *)type_local.id;
}

Assistant:

Expression* TranslateToFuzzReader::makeTryTable(Type type) {
  auto* body = make(type);

  if (funcContext->breakableStack.empty()) {
    // Nothing to break to, emit a trivial TryTable.
    // TODO: Perhaps generate a block wrapping us?
    return builder.makeTryTable(body, {}, {}, {});
  }

  if (wasm.tags.empty()) {
    addTag();
  }

  // Add catches of specific tags, and possibly a catch_all at the end. We use
  // the last iteration of the loop for that.
  std::vector<Name> catchTags;
  std::vector<Name> catchDests;
  std::vector<bool> catchRefs;
  auto numCatches = upTo(fuzzParams->MAX_TRY_CATCHES);
  for (Index i = 0; i <= numCatches; i++) {
    Name tagName;
    Type tagType;
    if (i < numCatches) {
      // Look for a specific tag.
      auto& tag = pick(wasm.tags);
      tagName = tag->name;
      tagType = tag->params();
    } else {
      // Add a catch_all at the end, some of the time (but all of the time if we
      // have nothing else).
      if (!catchTags.empty() && oneIn(2)) {
        break;
      }
      tagType = Type::none;
    }

    // We need to find a proper target to break to, which means a target that
    // has the type of the tag, or the tag + an exnref at the end.
    std::vector<Type> vec(tagType.begin(), tagType.end());
    // Use a non-nullable exnref here, and then the subtyping check below will
    // also accept a target that is nullable.
    vec.push_back(Type(HeapType::exn, NonNullable));
    auto tagTypeWithExn = Type(vec);
    int tries = fuzzParams->TRIES;
    while (tries-- > 0) {
      auto* target = pick(funcContext->breakableStack);
      auto dest = getTargetName(target);
      auto valueType = getTargetType(target);
      auto subOfTagType = Type::isSubType(tagType, valueType);
      auto subOfTagTypeWithExn = Type::isSubType(tagTypeWithExn, valueType);
      if (subOfTagType || subOfTagTypeWithExn) {
        catchTags.push_back(tagName);
        catchDests.push_back(dest);
        catchRefs.push_back(subOfTagTypeWithExn);
        break;
      }
    }
    // TODO: Perhaps generate a block wrapping us, if we fail to find a target?
    // TODO: It takes a bit of luck to find a target with an exnref - perhaps
    //       generate those?
  }

  return builder.makeTryTable(body, catchTags, catchDests, catchRefs);
}